

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QRect *r)

{
  QDebug *other;
  QDebugStateSaver *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  char in_stack_ffffffffffffff9f;
  QDebugStateSaver *in_stack_ffffffffffffffa0;
  Stream *pSVar1;
  QRect *in_stack_ffffffffffffffc8;
  QDebug *in_stack_ffffffffffffffd0;
  char *t;
  
  t = *(char **)(in_FS_OFFSET + 0x28);
  pSVar1 = in_RDI;
  QDebugStateSaver::QDebugStateSaver(in_RSI,(QDebug *)in_RDI);
  QDebug::nospace((QDebug *)in_RSI);
  other = QDebug::operator<<((QDebug *)in_stack_ffffffffffffffc8,t);
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
  QtDebugUtils::formatQRect<QRect>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
  QDebug::QDebug((QDebug *)in_RDI,other);
  QDebugStateSaver::~QDebugStateSaver(in_stack_ffffffffffffffa0);
  if (*(char **)(in_FS_OFFSET + 0x28) == t) {
    return (QDebug)pSVar1;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QRect &r)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QRect" << '(';
    QtDebugUtils::formatQRect(dbg, r);
    dbg << ')';
    return dbg;
}